

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cancellation_signal.hpp
# Opt level: O1

reactor_op_cancellation * __thiscall
asio::cancellation_slot::
emplace<asio::detail::reactive_socket_service_base::reactor_op_cancellation,asio::detail::epoll_reactor*,asio::detail::epoll_reactor::descriptor_state**,int&,asio::detail::epoll_reactor::op_types>
          (cancellation_slot *this,epoll_reactor **args,descriptor_state ***args_1,int *args_2,
          op_types *args_3)

{
  op_types oVar1;
  descriptor_state **ppdVar2;
  int iVar3;
  undefined4 extraout_var;
  cancellation_handler_base *pcVar4;
  _func_int **extraout_RDX;
  _func_int **pp_Var5;
  undefined8 uVar6;
  long *in_FS_OFFSET;
  
  if (*this->handler_ == (cancellation_handler_base *)0x0) {
    pp_Var5 = (_func_int **)0x0;
    pcVar4 = (cancellation_handler_base *)0x0;
  }
  else {
    iVar3 = (*(*this->handler_)->_vptr_cancellation_handler_base[1])();
    pcVar4 = (cancellation_handler_base *)CONCAT44(extraout_var,iVar3);
    *this->handler_ = (cancellation_handler_base *)0x0;
    pp_Var5 = extraout_RDX;
  }
  if (pp_Var5 < (_func_int **)0x28 || ((ulong)pcVar4 & 7) != 0) {
    if (pcVar4 != (cancellation_handler_base *)0x0) {
      if (*(long *)(*in_FS_OFFSET + -0x1420) == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x1420) + 8);
      }
      asio::detail::thread_info_base::
      deallocate<asio::detail::thread_info_base::cancellation_signal_tag>(uVar6,pcVar4,pp_Var5);
    }
    if (*(long *)(*in_FS_OFFSET + -0x1420) == 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x1420) + 8);
    }
    pp_Var5 = (_func_int **)0x28;
    pcVar4 = (cancellation_handler_base *)
             asio::detail::thread_info_base::
             allocate<asio::detail::thread_info_base::cancellation_signal_tag>(uVar6,0x28,8);
  }
  pcVar4->_vptr_cancellation_handler_base = (_func_int **)&PTR_call_005898a8;
  ppdVar2 = *args_1;
  iVar3 = *args_2;
  oVar1 = *args_3;
  pcVar4[1]._vptr_cancellation_handler_base = (_func_int **)*args;
  pcVar4[2]._vptr_cancellation_handler_base = (_func_int **)ppdVar2;
  *(int *)&pcVar4[3]._vptr_cancellation_handler_base = iVar3;
  *(op_types *)((long)&pcVar4[3]._vptr_cancellation_handler_base + 4) = oVar1;
  pcVar4[4]._vptr_cancellation_handler_base = pp_Var5;
  *this->handler_ = pcVar4;
  return (reactor_op_cancellation *)(pcVar4 + 1);
}

Assistant:

CancellationHandler& emplace(Args&&... args)
  {
    typedef detail::cancellation_handler<CancellationHandler>
      cancellation_handler_type;
    auto_delete_helper del = { prepare_memory(
        sizeof(cancellation_handler_type),
        alignof(CancellationHandler)) };
    cancellation_handler_type* handler_obj =
      new (del.mem.first) cancellation_handler_type(
        del.mem.second, static_cast<Args&&>(args)...);
    del.mem.first = 0;
    *handler_ = handler_obj;
    return handler_obj->handler();
  }